

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  uint overflow_00;
  uint64_t uVar1;
  
  uVar1 = secp256k1_read_be64(b32 + 0x18);
  r->d[0] = uVar1;
  uVar1 = secp256k1_read_be64(b32 + 0x10);
  r->d[1] = uVar1;
  uVar1 = secp256k1_read_be64(b32 + 8);
  r->d[2] = uVar1;
  uVar1 = secp256k1_read_be64(b32);
  r->d[3] = uVar1;
  overflow_00 = secp256k1_scalar_check_overflow(r);
  secp256k1_scalar_reduce(r,overflow_00);
  if (overflow != (int *)0x0) {
    *overflow = overflow_00;
  }
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int over;
    r->d[0] = secp256k1_read_be64(&b32[24]);
    r->d[1] = secp256k1_read_be64(&b32[16]);
    r->d[2] = secp256k1_read_be64(&b32[8]);
    r->d[3] = secp256k1_read_be64(&b32[0]);
    over = secp256k1_scalar_reduce(r, secp256k1_scalar_check_overflow(r));
    if (overflow) {
        *overflow = over;
    }
}